

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_key_push(wchar_t k)

{
  undefined1 local_1c [8];
  ui_event ke;
  wchar_t k_local;
  
  if (k == L'\0') {
    ke._8_4_ = 0xffffffff;
  }
  else {
    local_1c._0_4_ = EVT_KBRD;
    ke.type._0_1_ = 0;
    local_1c._4_4_ = k;
    ke.key.code = k;
    ke._8_4_ = Term_event_push((ui_event *)local_1c);
  }
  return ke._8_4_;
}

Assistant:

errr Term_key_push(int k)
{
	ui_event ke;

	if (!k) return (-1);

	ke.type = EVT_KBRD;
	ke.key.code = k;
	ke.key.mods = 0;

	return Term_event_push(&ke);
}